

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_ForkJoin.cpp
# Opt level: O3

void __thiscall amrex::ForkJoin::copy_data_to_tasks(ForkJoin *this)

{
  _Hash_node_base *p_Var1;
  char cVar2;
  BoxArray *__args;
  _Hash_node_base *p_Var3;
  long lVar4;
  DistributionMapping *__args_1;
  pointer piVar5;
  _Hash_node_base *p_Var6;
  long lVar7;
  char *pcVar8;
  pointer piVar9;
  long lVar10;
  _Hash_node_base *p_Var11;
  int task_idx;
  ulong uVar12;
  ostringstream *this_00;
  int task_comp_n;
  int local_1ec;
  long local_1e8;
  vector<amrex::MultiFab,std::allocator<amrex::MultiFab>> *local_1e0;
  FabArray<amrex::FArrayBox> *local_1d8;
  IntVect *local_1d0;
  DistributionMapping *local_1c8;
  BoxArray *local_1c0;
  Print local_1b8;
  
  if (this->flag_verbose == true) {
    local_1b8.os = OutStream();
    local_1b8.rank = *(int *)(DAT_0071a620 + -0x30);
    local_1b8.comm = *(MPI_Comm *)(DAT_0071a620 + -0x48);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b8.ss);
    *(undefined8 *)(&local_1b8.field_0x18 + *(long *)(local_1b8._16_8_ + -0x18)) =
         *(undefined8 *)(local_1b8.os + *(long *)(*(long *)local_1b8.os + -0x18) + 8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1b8.ss,"Copying data into fork-join tasks ...\n",0x26);
    Print::~Print(&local_1b8);
  }
  p_Var1 = (this->data)._M_h._M_before_begin._M_nxt;
  do {
    if (p_Var1 == (_Hash_node_base *)0x0) {
      return;
    }
    p_Var11 = p_Var1[5]._M_nxt;
    if (p_Var1[6]._M_nxt != p_Var11 && -1 < (long)p_Var1[6]._M_nxt - (long)p_Var11) {
      piVar5 = (this->split_bounds).super_vector<int,_std::allocator<int>_>.
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start;
      piVar9 = (this->split_bounds).super_vector<int,_std::allocator<int>_>.
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_finish;
      lVar10 = 0;
      do {
        local_1e0 = (vector<amrex::MultiFab,std::allocator<amrex::MultiFab>> *)
                    (p_Var11 + lVar10 * 10 + 7);
        local_1d8 = (FabArray<amrex::FArrayBox> *)p_Var11[lVar10 * 10]._M_nxt;
        local_1e8 = lVar10;
        std::vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>::reserve
                  ((vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> *)local_1e0,
                   ((long)piVar9 - (long)piVar5) * 0x40000000 + -0x100000000 >> 0x20);
        piVar5 = (this->split_bounds).super_vector<int,_std::allocator<int>_>.
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start;
        piVar9 = (this->split_bounds).super_vector<int,_std::allocator<int>_>.
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_finish;
        if (0 < (int)((ulong)((long)piVar9 - (long)piVar5) >> 2) + -1) {
          local_1c0 = &(local_1d8->super_FabArrayBase).boxarray;
          local_1c8 = &(local_1d8->super_FabArrayBase).distributionMap;
          local_1d0 = (IntVect *)((long)&p_Var11[lVar10 * 10 + 2]._M_nxt + 4);
          lVar7 = 0;
          uVar12 = 0;
          do {
            this_00 = &local_1b8.ss;
            if (*(int *)&p_Var11[lVar10 * 10 + 1]._M_nxt == 0) {
              p_Var3 = p_Var11[lVar10 * 10 + 8]._M_nxt;
              p_Var6 = p_Var11[lVar10 * 10 + 7]._M_nxt;
              if (uVar12 == *(uint *)&p_Var11[lVar10 * 10 + 2]._M_nxt) goto LAB_0043bda1;
              lVar4 = ((long)p_Var3 - (long)p_Var6 >> 7) * -0x5555555555555555;
              if (lVar4 - uVar12 == 0 || lVar4 < (long)uVar12) {
                MultiFab::MultiFab((MultiFab *)&local_1b8);
                std::vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>::
                emplace_back<amrex::MultiFab>
                          ((vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> *)local_1e0,
                           (MultiFab *)&local_1b8);
                MultiFab::~MultiFab((MultiFab *)&local_1b8);
              }
            }
            else {
              p_Var6 = p_Var11[lVar10 * 10 + 7]._M_nxt;
              p_Var3 = p_Var11[lVar10 * 10 + 8]._M_nxt;
LAB_0043bda1:
              local_1ec = *(int *)((long)&p_Var11[lVar10 * 10 + 4]._M_nxt[uVar12]._M_nxt + 4) -
                          *(int *)&p_Var11[lVar10 * 10 + 4]._M_nxt[uVar12]._M_nxt;
              lVar4 = ((long)p_Var3 - (long)p_Var6 >> 7) * -0x5555555555555555;
              task_idx = (int)uVar12;
              cVar2 = (char)this_00;
              if (lVar4 - uVar12 == 0 || lVar4 < (long)uVar12) {
                if (this->flag_verbose != false) {
                  local_1b8.os = OutStream();
                  local_1b8.rank = *(int *)(DAT_0071a620 + -0x30);
                  local_1b8.comm = *(MPI_Comm *)(DAT_0071a620 + -0x48);
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
                  *(undefined8 *)(&local_1b8.field_0x18 + *(long *)(local_1b8._16_8_ + -0x18)) =
                       *(undefined8 *)(local_1b8.os + *(long *)(*(long *)local_1b8.os + -0x18) + 8);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)this_00,"  Creating forked ",0x12);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)this_00,(char *)p_Var1[1]._M_nxt,(long)p_Var1[2]._M_nxt);
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"[",1);
                  std::ostream::operator<<(this_00,(int)local_1e8);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)this_00,"] for task ",0xb);
                  std::ostream::operator<<(this_00,task_idx);
                  pcVar8 = " (whole)";
                  if (*(int *)&p_Var11[lVar10 * 10 + 1]._M_nxt == 2) {
                    pcVar8 = " (split)";
                  }
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pcVar8,8);
                  std::ios::widen((char)*(undefined8 *)(local_1b8._16_8_ + -0x18) + cVar2);
                  std::ostream::put(cVar2);
                  std::ostream::flush();
                  Print::~Print(&local_1b8);
                }
                __args = local_1c0;
                __args_1 = get_dm(this,local_1c0,task_idx,local_1c8);
                std::vector<amrex::MultiFab,std::allocator<amrex::MultiFab>>::
                emplace_back<amrex::BoxArray_const&,amrex::DistributionMapping_const&,int&,amrex::IntVect&>
                          (local_1e0,__args,__args_1,&local_1ec,local_1d0);
              }
              else if (this->flag_verbose != false) {
                local_1b8.os = OutStream();
                local_1b8.rank = *(int *)(DAT_0071a620 + -0x30);
                local_1b8.comm = *(MPI_Comm *)(DAT_0071a620 + -0x48);
                std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
                *(undefined8 *)(&local_1b8.field_0x18 + *(long *)(local_1b8._16_8_ + -0x18)) =
                     *(undefined8 *)(local_1b8.os + *(long *)(*(long *)local_1b8.os + -0x18) + 8);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"  Forked ",9)
                ;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)this_00,(char *)p_Var1[1]._M_nxt,(long)p_Var1[2]._M_nxt);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"[",1);
                std::ostream::operator<<(this_00,(int)local_1e8);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)this_00,"] for task ",0xb);
                std::ostream::operator<<(this_00,task_idx);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)this_00," already created",0x10);
                std::ios::widen((char)*(undefined8 *)(local_1b8._16_8_ + -0x18) + cVar2);
                std::ostream::put(cVar2);
                std::ostream::flush();
                Print::~Print(&local_1b8);
              }
              if (((ulong)p_Var11[lVar10 * 10 + 1]._M_nxt & 0xfffffffd00000000) == 0) {
                if (this->flag_verbose == true) {
                  local_1b8.os = OutStream();
                  local_1b8.rank = *(int *)(DAT_0071a620 + -0x30);
                  local_1b8.comm = *(MPI_Comm *)(DAT_0071a620 + -0x48);
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
                  *(undefined8 *)(&local_1b8.field_0x18 + *(long *)(local_1b8._16_8_ + -0x18)) =
                       *(undefined8 *)(local_1b8.os + *(long *)(*(long *)local_1b8.os + -0x18) + 8);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)this_00,"    Copying ",0xc);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)this_00,(char *)p_Var1[1]._M_nxt,(long)p_Var1[2]._M_nxt);
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"[",1);
                  std::ostream::operator<<(this_00,(int)local_1e8);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)this_00,"] components [",0xe);
                  std::ostream::operator<<
                            (this_00,*(int *)&p_Var11[lVar10 * 10 + 4]._M_nxt[uVar12]._M_nxt);
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
                  std::ostream::operator<<
                            (this_00,*(int *)((long)&p_Var11[lVar10 * 10 + 4]._M_nxt[uVar12]._M_nxt
                                             + 4));
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)this_00,") into to task ",0xf);
                  std::ostream::operator<<(this_00,task_idx);
                  std::ios::widen((char)*(undefined8 *)(local_1b8._16_8_ + -0x18) + cVar2);
                  std::ostream::put(cVar2);
                  std::ostream::flush();
                  Print::~Print(&local_1b8);
                }
                FabArray<amrex::FArrayBox>::Redistribute
                          ((FabArray<amrex::FArrayBox> *)
                           ((long)&(p_Var11[lVar10 * 10 + 7]._M_nxt)->_M_nxt + lVar7),local_1d8,
                           *(int *)&p_Var11[lVar10 * 10 + 4]._M_nxt[uVar12]._M_nxt,0,local_1ec,
                           local_1d0);
              }
            }
            uVar12 = uVar12 + 1;
            piVar5 = (this->split_bounds).super_vector<int,_std::allocator<int>_>.
                     super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                     _M_start;
            piVar9 = (this->split_bounds).super_vector<int,_std::allocator<int>_>.
                     super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                     _M_finish;
            lVar7 = lVar7 + 0x180;
          } while ((long)uVar12 < ((long)piVar9 - (long)piVar5) * 0x40000000 + -0x100000000 >> 0x20)
          ;
        }
        lVar10 = local_1e8 + 1;
        p_Var11 = p_Var1[5]._M_nxt;
        lVar7 = ((long)p_Var1[6]._M_nxt - (long)p_Var11 >> 4) * -0x3333333333333333;
      } while (lVar7 - lVar10 != 0 && lVar10 <= lVar7);
    }
    p_Var1 = p_Var1->_M_nxt;
  } while( true );
}

Assistant:

void
ForkJoin::copy_data_to_tasks ()
{
    BL_PROFILE("ForkJoin::copy_data_to_tasks()");
    if (flag_verbose) {
        amrex::Print() << "Copying data into fork-join tasks ...\n";
    }
    for (auto &p : data) { // for each name
        const auto &mf_name = p.first;
        for (int idx = 0; idx < p.second.size(); ++idx) { // for each index
            auto &mff = p.second[idx];
            const auto &orig = *mff.orig;
            const auto &ba = orig.boxArray();
            const auto &comp_split = mff.comp_split;
            auto &forked = mff.forked;

            forked.reserve(NTasks()); // does nothing if forked MFs already created
            for (int i = 0; i < NTasks(); ++i) {
                // check if this task needs this MF
                if (mff.strategy != Strategy::single || i == mff.owner_task) {
                    int task_comp_n = comp_split[i].hi - comp_split[i].lo;

                    // create task's MF if first time through
                    if (forked.size() <= i) {
                        if (flag_verbose) {
                            amrex::Print() << "  Creating forked " << mf_name << "[" << idx << "] for task " << i
                                           << (mff.strategy == Strategy::split ? " (split)" : " (whole)") << std::endl;
                        }
                        // look up the distribution mapping for this (box array, task) pair
                        const DistributionMapping &dm = get_dm(ba, i, orig.DistributionMap());
                        forked.emplace_back(ba, dm, task_comp_n, mff.ngrow);
                    } else if (flag_verbose) {
                        amrex::Print() << "  Forked " << mf_name << "[" << idx << "] for task " << i
                                       << " already created" << std::endl;
                    }
                    AMREX_ASSERT(i < forked.size());

                    // copy data if needed
                    if (mff.intent == Intent::in || mff.intent == Intent::inout) {
                        if (flag_verbose) {
                            amrex::Print() << "    Copying " << mf_name << "[" << idx << "] components ["
                                           << comp_split[i].lo << ", " << comp_split[i].hi << ") into to task " << i << std::endl;
                        }
                        // parallel copy data into forked MF
                        forked[i].Redistribute(orig, comp_split[i].lo, 0, task_comp_n, mff.ngrow);
                    }

                } else {
                    // this task doesn't use the MultiFab
                    if (forked.size() <= i) {
                        // first time through, push empty placeholder (not used)
                        forked.push_back(MultiFab());
                    }
                }
            }
            AMREX_ASSERT(forked.size() == NTasks());
        }
    }
}